

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandPrintSymms(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint local_44;
  uint local_40;
  int fVerbose;
  int fReorder;
  int fNaive;
  int fUseBdds;
  int c;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  fReorder = 0;
  fVerbose = 0;
  local_40 = 1;
  local_44 = 0;
  Extra_UtilGetoptReset();
LAB_00262863:
  iVar1 = Extra_UtilGetopt(argc,argv,"bnrvh");
  if (iVar1 == -1) {
    if (pAVar2 == (Abc_Ntk_t *)0x0) {
      Abc_Print(-1,"Empty network.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      iVar1 = Abc_NtkIsComb(pAVar2);
      if (iVar1 == 0) {
        Abc_Print(-1,"This command works only for combinational networks (run \"comb\").\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        iVar1 = Abc_NtkIsStrash(pAVar2);
        if (iVar1 == 0) {
          pAVar2 = Abc_NtkStrash(pAVar2,0,0,0);
          Abc_NtkSymmetries(pAVar2,fReorder,fVerbose,local_40,local_44);
          Abc_NtkDelete(pAVar2);
        }
        else {
          Abc_NtkSymmetries(pAVar2,fReorder,fVerbose,local_40,local_44);
        }
        pAbc_local._4_4_ = 0;
      }
    }
    return pAbc_local._4_4_;
  }
  switch(iVar1) {
  case 0x62:
    fReorder = fReorder ^ 1;
    goto LAB_00262863;
  default:
    break;
  case 0x68:
    break;
  case 0x6e:
    fVerbose = fVerbose ^ 1;
    goto LAB_00262863;
  case 0x72:
    local_40 = local_40 ^ 1;
    goto LAB_00262863;
  case 0x76:
    goto switchD_002628a1_caseD_76;
  }
  Abc_Print(-2,"usage: print_symm [-bnrvh]\n");
  Abc_Print(-2,"\t         computes symmetries of the PO functions\n");
  pcVar3 = "SAT";
  if (fReorder != 0) {
    pcVar3 = "BDD";
  }
  Abc_Print(-2,"\t-b     : toggle BDD-based or SAT-based computations [default = %s].\n",pcVar3);
  pcVar3 = "no";
  if (fVerbose != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-n     : enable naive BDD-based computation [default = %s].\n",pcVar3);
  pcVar3 = "no";
  if (local_40 != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-r     : enable dynamic BDD variable reordering [default = %s].\n",pcVar3);
  pcVar3 = "no";
  if (local_44 != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-v     : enable verbose output [default = %s].\n",pcVar3);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
switchD_002628a1_caseD_76:
  local_44 = local_44 ^ 1;
  goto LAB_00262863;
}

Assistant:

int Abc_CommandPrintSymms( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fUseBdds;
    int fNaive;
    int fReorder;
    int fVerbose;
    extern void Abc_NtkSymmetries( Abc_Ntk_t * pNtk, int fUseBdds, int fNaive, int fReorder, int fVerbose );

    // set defaults
    fUseBdds = 0;
    fNaive   = 0;
    fReorder = 1;
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "bnrvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'b':
            fUseBdds ^= 1;
            break;
        case 'n':
            fNaive ^= 1;
            break;
        case 'r':
            fReorder ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsComb(pNtk) )
    {
        Abc_Print( -1, "This command works only for combinational networks (run \"comb\").\n" );
        return 1;
    }
    if ( Abc_NtkIsStrash(pNtk) )
        Abc_NtkSymmetries( pNtk, fUseBdds, fNaive, fReorder, fVerbose );
    else
    {
        pNtk = Abc_NtkStrash( pNtk, 0, 0, 0 );
        Abc_NtkSymmetries( pNtk, fUseBdds, fNaive, fReorder, fVerbose );
        Abc_NtkDelete( pNtk );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: print_symm [-bnrvh]\n" );
    Abc_Print( -2, "\t         computes symmetries of the PO functions\n" );
    Abc_Print( -2, "\t-b     : toggle BDD-based or SAT-based computations [default = %s].\n", fUseBdds? "BDD": "SAT" );
    Abc_Print( -2, "\t-n     : enable naive BDD-based computation [default = %s].\n", fNaive? "yes": "no" );
    Abc_Print( -2, "\t-r     : enable dynamic BDD variable reordering [default = %s].\n", fReorder? "yes": "no" );
    Abc_Print( -2, "\t-v     : enable verbose output [default = %s].\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}